

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermSubstitutionTree.hpp
# Opt level: O2

void __thiscall
Indexing::TermSubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::handle
          (TermSubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs> *this,LeafData *d,
          bool insert)

{
  SelectedSummand SStack_48;
  
  Kernel::SelectedSummand::SelectedSummand(&SStack_48,&d->super_SelectedSummand);
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::handle
            (&this->_inner,(LeafData *)&SStack_48,insert);
  return;
}

Assistant:

void handle(LeafData d, bool insert) final override
  { _inner.handle(std::move(d), insert); }